

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::
setupSmallBuildRefBuilder
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this,size_t objectID
          ,TriangleMesh *param_2)

{
  pointer puVar1;
  long lVar2;
  __uniq_ptr_impl<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
  _Var3;
  __uniq_ptr_impl<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
  _Var4;
  
  puVar1 = (this->builders).
           super__Vector_base<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var4._M_t.
  super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
  .
  super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
  ._M_head_impl =
       puVar1[objectID]._M_t.
       super___uniq_ptr_impl<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
       ._M_t;
  if ((_Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
       )_Var4._M_t.
        super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
        .
        super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
        ._M_head_impl == (RefBuilderBase *)0x0) {
    _Var4._M_t.
    super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
    .
    super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
    ._M_head_impl =
         (tuple<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
          )::operator_new(0x10);
    *(undefined ***)
     _Var4._M_t.
     super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
     .
     super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
     ._M_head_impl = &PTR__RefBuilderBase_021debe8;
    *(size_t *)
     ((long)_Var4._M_t.
            super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
            .
            super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
            ._M_head_impl + 8) = objectID;
    puVar1[objectID]._M_t.
    super___uniq_ptr_impl<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
    ._M_t = _Var4._M_t.
            super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
            .
            super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
            ._M_head_impl;
  }
  else {
    lVar2 = __dynamic_cast(_Var4._M_t.
                           super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
                           .
                           super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
                           ._M_head_impl,
                           &BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::
                            RefBuilderBase::typeinfo,
                           &BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleM<4>>::
                            RefBuilderSmall::typeinfo,0);
    if (lVar2 == 0) {
      _Var3._M_t.
      super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
      .
      super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
      ._M_head_impl =
           (tuple<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
            )::operator_new(0x10);
      *(undefined ***)
       _Var3._M_t.
       super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
       .
       super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
       ._M_head_impl = &PTR__RefBuilderBase_021debe8;
      *(size_t *)
       ((long)_Var3._M_t.
              super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
              .
              super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
              ._M_head_impl + 8) = objectID;
      puVar1[objectID]._M_t.
      super___uniq_ptr_impl<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
      ._M_t = _Var3._M_t.
              super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
              .
              super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
              ._M_head_impl;
      if ((_Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
           )_Var4._M_t.
            super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
            .
            super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
            ._M_head_impl != (RefBuilderBase *)0x0) {
        (**(code **)(*(long *)_Var4._M_t.
                              super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
                              .
                              super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
                              ._M_head_impl + 8))
                  (_Var4._M_t.
                   super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
                   .
                   super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
                   ._M_head_impl);
        return;
      }
    }
  }
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupSmallBuildRefBuilder (size_t objectID, Mesh const * const /*mesh*/)
    {
      if (builders[objectID] == nullptr ||                                         // new mesh
          dynamic_cast<RefBuilderSmall*>(builders[objectID].get()) == nullptr)     // size change resulted in large->small change
      {
        builders[objectID].reset (new RefBuilderSmall(objectID));
      }
    }